

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ym3438.c
# Opt level: O3

void NOPN2_Clock(ym3438_t *chip,Bit32s *buffer)

{
  byte bVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  ushort uVar6;
  byte bVar7;
  byte bVar8;
  Bit8u BVar9;
  short sVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  Bit32u BVar14;
  Bit8u *pBVar15;
  byte bVar16;
  short sVar17;
  Bit16u BVar18;
  ushort uVar19;
  byte bVar20;
  char cVar21;
  ushort uVar22;
  byte bVar23;
  byte bVar24;
  uint uVar25;
  uint uVar26;
  ulong uVar27;
  byte bVar28;
  short sVar29;
  Bit32s BVar30;
  byte bVar31;
  Bit8u BVar32;
  ushort uVar33;
  ulong uVar34;
  uint uVar35;
  ulong uVar36;
  ulong uVar37;
  bool bVar38;
  bool bVar39;
  ushort uVar40;
  ushort local_40;
  
  uVar35 = chip->cycles;
  uVar36 = (ulong)uVar35;
  chip->pg_read = chip->pg_read >> 1;
  chip->eg_read[1] = chip->eg_read[1] >> 1;
  bVar16 = chip->eg_cycle + 1;
  bVar8 = chip->mode_test_21[1];
  chip->lfo_inc = bVar8;
  chip->eg_cycle = bVar16;
  if (uVar36 == 1) {
    if (chip->eg_quotient == 2) {
      if (chip->eg_cycle_stop == '\0') {
        BVar9 = chip->eg_shift + '\x01';
      }
      else {
        BVar9 = '\0';
      }
      chip->eg_shift_lock = BVar9;
      uVar33 = chip->eg_timer;
      chip->eg_timer_low_lock = (byte)uVar33 & 3;
    }
    else {
      uVar33 = chip->eg_timer;
    }
    uVar11 = chip->eg_quotient + 1;
    uVar11 = uVar11 + ((uVar11 & 0xffff) / 3) * -3;
    chip->eg_quotient = (Bit16u)uVar11;
    chip->eg_cycle = '\0';
    chip->eg_cycle_stop = '\x01';
    chip->eg_shift = '\0';
    uVar11 = (uint)uVar33 + ((uint)chip->eg_timer_inc | (uVar11 & 0xffff) >> 1);
    chip->eg_timer_inc = (Bit8u)((uVar11 & 0xffff) >> 0xc);
    chip->eg_timer = (ushort)uVar11 & 0xfff;
LAB_0013d880:
    bVar16 = 0;
  }
  else if ((int)uVar35 < 0xd) {
    if (uVar35 == 0) {
      bVar20 = chip->lfo_cnt;
      chip->lfo_pm = bVar20 >> 2;
      bVar23 = bVar20 & 0x3f;
      if ((bVar20 & 0x40) == 0) {
        bVar23 = bVar20 ^ 0x3f;
      }
      chip->lfo_am = bVar23 * '\x02';
    }
    else if (uVar35 == 2) {
      chip->pg_read = chip->pg_phase[0x15] & 0x3ff;
      chip->eg_read[1] = (uint)chip->eg_out[0];
    }
  }
  else {
    if (uVar35 == 0xd) {
      chip->eg_cycle = '\0';
      chip->eg_cycle_stop = '\x01';
      chip->eg_shift = '\0';
      uVar33 = (ushort)chip->eg_timer_inc + chip->eg_timer;
      chip->eg_timer_inc = (byte)(uVar33 >> 0xc);
      chip->eg_timer = uVar33 & 0xfff;
      goto LAB_0013d880;
    }
    if (uVar35 == 0x17) {
      bVar8 = bVar8 | 1;
      chip->lfo_inc = bVar8;
    }
  }
  uVar12 = ~((uint)chip->mode_test_21[5] << (bVar16 & 0x1f)) & (uint)chip->eg_timer;
  chip->eg_timer = (Bit16u)uVar12;
  uVar11._0_1_ = chip->eg_custom_timer;
  uVar11._1_1_ = chip->eg_rate;
  uVar11._2_1_ = chip->eg_ksv;
  uVar11._3_1_ = chip->eg_inc;
  if (((chip->pin_test_in & uVar11 | uVar12 >> (bVar16 & 0x1f)) & (uint)chip->eg_cycle_stop) != 0) {
    chip->eg_shift = bVar16;
    chip->eg_cycle_stop = '\0';
  }
  bVar20 = chip->write_a & 3;
  chip->write_a_en = bVar20 == 1;
  bVar23 = chip->write_d & 3;
  bVar38 = bVar23 == 1;
  chip->write_d_en = bVar38;
  chip->write_a = chip->write_a * '\x02';
  chip->write_d = chip->write_d * '\x02';
  BVar9 = chip->write_busy;
  chip->busy = BVar9;
  bVar16 = chip->write_busy_cnt + BVar9;
  bVar39 = bVar16 < 0x20 || bVar38;
  if (BVar9 == '\0') {
    bVar39 = bVar38;
  }
  chip->write_busy = bVar39;
  chip->write_busy_cnt = bVar16 & 0x1f;
  bVar16 = chip->timer_a_overflow;
  if (uVar35 == 2) {
    bVar24 = (chip->timer_a_load != '\0' && chip->timer_a_load_lock == '\0') | bVar16;
    chip->timer_a_load_lock = chip->timer_a_load;
    bVar31 = 0;
    if (chip->mode_csm != '\0') {
      bVar31 = bVar24;
    }
    chip->mode_kon_csm = bVar31;
    uVar33 = chip->ch_out[(ulong)(chip->timer_a_load_latch != '\0') + 9];
    chip->timer_a_load_latch = bVar24;
LAB_0013d9a9:
    if (chip->mode_test_21[2] != '\0') goto LAB_0013d9b2;
  }
  else {
    uVar33 = chip->ch_out[(ulong)(chip->timer_a_load_latch != '\0') + 9];
    chip->timer_a_load_latch = bVar16;
    if ((uVar35 != 1) || (chip->timer_a_load_lock == '\0')) goto LAB_0013d9a9;
LAB_0013d9b2:
    uVar33 = uVar33 + 1;
  }
  if (chip->timer_a_reset == '\0') {
    chip->timer_a_overflow_flag = chip->timer_a_overflow_flag | bVar16 & chip->timer_a_enable;
  }
  else {
    chip->timer_a_reset = '\0';
    chip->timer_a_overflow_flag = '\0';
  }
  chip->timer_a_overflow = (byte)(uVar33 >> 10);
  chip->timer_a_cnt = uVar33 & 0x3ff;
  bVar16 = chip->timer_b_overflow;
  if (uVar35 == 2) {
    BVar9 = chip->timer_b_load_lock;
    chip->timer_b_load_lock = chip->timer_b_load;
    uVar33 = *(ushort *)(chip->mode_test_21 + (ulong)(chip->timer_b_load_latch != '\0') * 4 + -0xd);
    chip->timer_b_load_latch = (chip->timer_b_load != '\0' && BVar9 == '\0') | bVar16;
  }
  else {
    uVar33 = *(ushort *)(chip->mode_test_21 + (ulong)(chip->timer_b_load_latch != '\0') * 4 + -0xd);
    chip->timer_b_load_latch = bVar16;
    if (uVar35 == 1) {
      chip->timer_b_subcnt = chip->timer_b_subcnt + '\x01';
    }
  }
  if (((chip->timer_b_subcnt == 0x10) && (chip->timer_b_load_lock != '\0')) ||
     (chip->mode_test_21[2] != '\0')) {
    uVar33 = uVar33 + 1;
  }
  chip->timer_b_subcnt = chip->timer_b_subcnt & 0xf;
  if (chip->timer_b_reset == '\0') {
    chip->timer_b_overflow_flag = chip->timer_b_overflow_flag | bVar16 & chip->timer_b_enable;
  }
  else {
    chip->timer_b_reset = '\0';
    chip->timer_b_overflow_flag = '\0';
  }
  chip->timer_b_overflow = (Bit8u)(uVar33 >> 8);
  chip->timer_b_cnt = uVar33 & 0xff;
  uVar11 = chip->channel;
  uVar37 = (ulong)uVar11;
  chip->eg_kon_latch[uVar36] = chip->mode_kon[uVar36];
  chip->eg_kon_csm[uVar36] = '\0';
  if ((uVar37 == 2) && (chip->mode_kon_csm != '\0')) {
    chip->eg_kon_latch[uVar36] = '\x01';
    chip->eg_kon_csm[uVar36] = '\x01';
  }
  if (uVar35 == chip->mode_kon_channel) {
    chip->mode_kon[uVar37] = chip->mode_kon_operator[0];
    chip->mode_kon[uVar11 + 0xc] = chip->mode_kon_operator[1];
    chip->mode_kon[uVar11 + 6] = chip->mode_kon_operator[2];
    chip->mode_kon[uVar11 + 0x12] = chip->mode_kon_operator[3];
  }
  bVar16 = chip->mode_test_2c[5];
  uVar33 = chip->ch_lock;
  chip->ch_read = uVar33;
  uVar25 = uVar11 + (uVar35 < 0xc);
  uVar12 = uVar35 & 3;
  if (uVar12 == 0) {
    if (bVar16 == 0) {
      uVar33 = chip->ch_out[uVar25];
      chip->ch_lock = uVar33;
    }
    chip->ch_lock_l = chip->pan_l[uVar25];
    chip->ch_lock_r = chip->pan_r[uVar25];
  }
  if ((uVar35 & 0xfffffffc) == 4) {
    if (chip->dacen != '\0' || bVar16 != 0) {
LAB_0013dbc2:
      uVar33 = (chip->dacdata & 0xffU) - (chip->dacdata & 0x100U);
    }
  }
  else if (bVar16 != 0) goto LAB_0013dbc2;
  chip->mol = 0;
  chip->mor = 0;
  if ((chip->chip_type & 1) == 0) {
    BVar30 = 0;
    if (chip->ch_lock_l == '\0') {
      local_40 = 0;
    }
    else {
      local_40 = 0;
      if (uVar12 != 0 || bVar16 != 0) {
        chip->mol = uVar33;
        local_40 = uVar33;
      }
    }
    if (chip->ch_lock_r != '\0' && (uVar12 != 0 || bVar16 != 0)) goto LAB_0013dc7a;
  }
  else {
    sVar17 = uVar33 + -((short)~uVar33 >> 0xf);
    sVar29 = -((short)~uVar33 >> 0xf) + (short)(char)(uVar33 >> 8);
    sVar10 = sVar29;
    if (bVar16 != 0) {
      sVar10 = sVar17;
    }
    if (uVar12 == 3) {
      sVar10 = sVar17;
    }
    sVar17 = sVar29;
    if (chip->ch_lock_l != '\0') {
      sVar17 = sVar10;
    }
    if (chip->ch_lock_r == '\0') {
      sVar10 = sVar29;
    }
    local_40 = sVar17 * 3;
    chip->mol = local_40;
    uVar33 = sVar10 * 3;
LAB_0013dc7a:
    chip->mor = uVar33;
    BVar30 = (Bit32s)(short)uVar33;
  }
  uVar12 = (uVar35 + 0x12) % 0x18;
  uVar33 = (ushort)bVar16;
  if (*(int *)((ulong)((uVar12 / 6) * 0xc0) + 0x177a90 + (ulong)chip->connect[uVar37] * 4) != 0 &&
      bVar16 == 0) {
    uVar33 = (ushort)((uint)(int)chip->fm_out[uVar12] >> 5);
  }
  sVar10 = chip->ch_acc[uVar37];
  if (uVar12 < 6 || bVar16 != 0) {
    chip->ch_out[uVar37] = sVar10;
  }
  uVar22 = 0;
  sVar17 = 0;
  if (bVar16 != 0) {
    sVar17 = sVar10;
  }
  if (5 < uVar12) {
    sVar17 = sVar10;
  }
  sVar10 = -0x100;
  if (-0x100 < (short)(uVar33 + sVar17)) {
    sVar10 = uVar33 + sVar17;
  }
  if (0xfe < sVar10) {
    sVar10 = 0xff;
  }
  chip->ch_acc[uVar37] = sVar10;
  uVar25 = (uVar35 + 6) % 0x18;
  uVar27 = (ulong)chip->connect[uVar37];
  uVar34 = (ulong)((uVar25 / 6) * 0xc0);
  if (*(int *)((long)fm_algorithm[0][0] + uVar27 * 4 + uVar34) != 0) {
    uVar22 = chip->fm_op1[uVar37][0];
  }
  if (*(int *)(uVar34 + 0x177a10 + uVar27 * 4) == 0) {
    uVar33 = 0;
  }
  else {
    uVar33 = chip->fm_op1[uVar37][1];
  }
  if (*(int *)(uVar34 + 0x177a30 + uVar27 * 4) != 0) {
    uVar33 = uVar33 | chip->fm_op2[uVar37];
  }
  if (*(int *)(uVar34 + 0x177a50 + uVar27 * 4) != 0) {
    uVar22 = uVar22 | chip->fm_out[uVar12];
  }
  if (*(int *)(uVar34 + 0x177a70 + uVar27 * 4) != 0) {
    uVar33 = uVar33 | chip->fm_out[uVar12];
  }
  if (uVar25 < 6) {
    BVar18 = 0;
    if (chip->fb[uVar37] != '\0') {
      BVar18 = (Bit16u)((int)(short)(uVar33 + uVar22) >> (10 - chip->fb[uVar37] & 0x1f));
    }
  }
  else {
    BVar18 = (Bit16u)((uint)(int)(short)(uVar33 + uVar22) >> 1);
  }
  chip->fm_mod[uVar25] = BVar18;
  if (uVar12 < 6) {
    chip->fm_op1[uVar37][1] = chip->fm_op1[uVar37][0];
    chip->fm_op1[uVar37][0] = chip->fm_out[uVar12];
  }
  else if (uVar12 - 0xc < 6) {
    chip->fm_op2[uVar37] = chip->fm_out[uVar12];
  }
  uVar13 = ((uVar35 + 0x13) / 0x18) * -0x18 + uVar35 + 0x13;
  uVar12 = chip->pg_phase[uVar13];
  uVar33 = (short)(uVar12 >> 10) + chip->fm_mod[uVar13];
  uVar25 = ~(uint)uVar33;
  if ((uVar33 & 0x100) == 0) {
    uVar25 = (uint)uVar33;
  }
  uVar25 = (uint)(ushort)(chip->eg_out[uVar13] * 4 + logsinrom[uVar25 & 0xff]);
  if (0x1ffe < uVar25) {
    uVar25 = 0x1fff;
  }
  uVar19 = (ushort)chip->mode_test_21[4] << 0xd ^
           (ushort)(((uint)exprom[~uVar25 & 0xff] << 2 | 0x1000) >> ((byte)(uVar25 >> 8) & 0x1f));
  uVar22 = -uVar19;
  if ((uVar33 & 0x200) == 0) {
    uVar22 = uVar19;
  }
  chip->fm_out[uVar13] = (uVar22 & 0x1fff) - (uVar22 & 0x2000);
  uVar25 = ((uVar35 + 0x14) / 0x18) * -0x18 + uVar35 + 0x14;
  if (chip->pg_reset[uVar25] != '\0') {
    chip->pg_inc[uVar25] = 0;
  }
  uVar26 = 0;
  uVar25 = 0;
  if ((chip->pg_reset[uVar13] == '\0') && (uVar25 = 0, chip->mode_test_21[3] == '\0')) {
    uVar25 = uVar12;
  }
  chip->pg_phase[uVar13] = uVar25 + chip->pg_inc[uVar13] & 0xfffff;
  bVar7 = chip->lfo_pm & 0xf;
  bVar16 = chip->pms[uVar37];
  bVar31 = chip->dt[uVar36];
  bVar24 = bVar7 ^ 0xf;
  if (bVar7 < 8) {
    bVar24 = bVar7;
  }
  bVar7 = bVar31 & 3;
  if (bVar7 != 0) {
    bVar28 = 0x1c;
    if (chip->pg_kcode < 0x1c) {
      bVar28 = chip->pg_kcode;
    }
    uVar26 = pg_detune[((bVar7 == 3) + (bVar28 >> 2)) * '\x04' + 0x24 & 4 | bVar28 & 3] >>
             (9 - ((byte)((bVar31 & 2 | bVar7 == 3) + (bVar28 >> 2) + 9) >> 1) & 0x1f) & 0xff;
  }
  uVar33 = chip->pg_fnum >> 4;
  bVar7 = bVar16 - 5;
  if (bVar16 < 6) {
    bVar7 = 0;
  }
  uVar25 = ((uint)(uVar33 >> ((byte)pg_lfo_sh2[bVar16][bVar24] & 0x1f)) +
            (uint)(uVar33 >> ((byte)pg_lfo_sh1[bVar16][bVar24] & 0x1f)) << (bVar7 & 0x1f)) >> 2;
  uVar12 = -uVar25;
  if ((chip->lfo_pm & 0x10) == 0) {
    uVar12 = uVar25;
  }
  uVar25 = -uVar26;
  if ((bVar31 & 4) == 0) {
    uVar25 = uVar26;
  }
  chip->pg_inc[uVar36] =
       (uint)chip->multi[uVar36] *
       (uVar25 + (((uVar12 + (uint)chip->pg_fnum * 2 & 0xfff) << (chip->pg_block & 0x1f)) >> 2) &
       0x1ffff) >> 1 & 0xfffff;
  uVar12 = (uVar35 + 0x16) % 0x18;
  BVar9 = chip->eg_kon_latch[uVar12];
  bVar16 = chip->eg_state[uVar12];
  BVar32 = chip->eg_kon[uVar12];
  chip->eg_read[0] = (uint)chip->eg_read_inc;
  bVar31 = chip->eg_inc;
  chip->eg_read_inc = bVar31 != 0;
  if (BVar32 == '\0' && BVar9 != '\0') {
    chip->pg_reset[uVar12] = '\x01';
    bVar39 = false;
  }
  else {
    chip->pg_reset[uVar12] = chip->eg_ssg_pgrst_latch[uVar12] != '\0';
    if (BVar32 == '\0') {
      bVar39 = true;
    }
    else {
      bVar39 = chip->eg_ssg_repeat_latch[uVar12] == '\0';
    }
  }
  uVar33 = chip->eg_level[uVar12];
  uVar22 = 0x200 - uVar33 & 0x3ff;
  if (chip->eg_ssg_inv[uVar12] == '\0') {
    uVar22 = uVar33;
  }
  if (BVar32 == '\0') {
    uVar22 = uVar33;
  }
  if (BVar9 != '\0') {
    uVar22 = uVar33;
  }
  BVar32 = chip->eg_ssg_enable[uVar12];
  cVar21 = (~uVar22 & 0x3f0) == 0;
  if (BVar32 != '\0') {
    cVar21 = (char)((int)(short)uVar22 >> 9);
  }
  if (bVar39) {
    bVar7 = bVar16;
    if (bVar16 - 2 < 2) {
      if (bVar31 == 0 || cVar21 != '\0') {
LAB_0013e228:
        sVar10 = 0;
      }
      else {
        sVar10 = (short)(1 << (bVar31 - 1 & 0x1f));
        if (BVar32 != '\0') {
          sVar10 = (short)(4 << (bVar31 - 1 & 0x1f));
        }
      }
    }
    else {
      if (bVar16 == 1) {
        if ((uint)chip->eg_sl[1] * 2 == (int)(short)uVar22 >> 4) {
          bVar7 = 2;
        }
        else {
          bVar7 = 1;
          if (bVar31 != 0 && cVar21 == '\0') {
            sVar10 = (short)(1 << (bVar31 - 1 & 0x1f));
            bVar7 = 1;
            if (BVar32 != '\0') {
              sVar10 = (short)(4 << (bVar31 - 1 & 0x1f));
            }
            goto LAB_0013e2ce;
          }
        }
      }
      else {
        if (bVar16 != 0) goto LAB_0013e228;
        if (uVar22 == 0) {
          bVar7 = 1;
        }
        else {
          if (bVar31 != 0) {
            sVar10 = 0;
            bVar7 = 0;
            if ((BVar9 != '\0') && (chip->eg_ratemax == '\0')) {
              sVar10 = (short)((uint)((int)(short)~uVar22 << (bVar31 & 0x1f)) >> 5);
              bVar7 = 0;
            }
            goto LAB_0013e2ce;
          }
          bVar7 = 0;
        }
      }
      sVar10 = 0;
    }
LAB_0013e2ce:
    bVar24 = 3;
    if (BVar9 != '\0') {
      bVar24 = bVar7;
    }
  }
  else if (chip->eg_ratemax == '\0') {
    bVar24 = 0;
    sVar10 = 0;
    if ((((bVar16 == 0) && (uVar22 != 0)) && (sVar10 = 0, BVar9 != '\0')) && (bVar31 != 0)) {
      sVar10 = (short)((uint)((int)(short)~uVar22 << (bVar31 & 0x1f)) >> 5);
      bVar24 = 0;
    }
  }
  else {
    uVar22 = 0;
    bVar24 = 0;
    sVar10 = 0;
  }
  if (chip->eg_kon_csm[uVar12] != '\0') {
    uVar22 = uVar22 | (ushort)chip->eg_tl[1] << 3;
  }
  uVar33 = uVar22;
  bVar31 = bVar24;
  if ((bVar39) && (chip->eg_ssg_hold_up_latch[uVar12] == '\0')) {
    uVar33 = 0x3ff;
    if (bVar16 == 0 || cVar21 == '\0') {
      uVar33 = uVar22;
    }
    bVar31 = 3;
    if (bVar16 == 0 || cVar21 == '\0') {
      bVar31 = bVar24;
    }
  }
  chip->eg_kon[uVar12] = BVar9;
  chip->eg_level[uVar12] = uVar33 + sVar10 & 0x3ff;
  chip->eg_state[uVar12] = bVar31;
  uVar12 = (uVar35 + 0x17) % 0x18;
  uVar33 = 0x200 - chip->eg_level[uVar12];
  if (chip->eg_ssg_inv[uVar12] == '\0') {
    uVar33 = chip->eg_level[uVar12];
  }
  uVar22 = 0;
  if (chip->mode_test_21[5] == '\0') {
    uVar22 = uVar33 & 0x3ff;
  }
  uVar22 = chip->eg_lfo_am + uVar22;
  if ((uVar11 != 3) || (chip->mode_csm == '\0')) {
    uVar22 = uVar22 + (ushort)chip->eg_tl[0] * 8;
  }
  if (0x3fe < uVar22) {
    uVar22 = 0x3ff;
  }
  chip->eg_out[uVar12] = uVar22;
  chip->eg_ssg_pgrst_latch[uVar36] = '\0';
  chip->eg_ssg_repeat_latch[uVar36] = '\0';
  chip->eg_ssg_hold_up_latch[uVar36] = '\0';
  bVar16 = chip->ssg_eg[uVar36];
  if ((bVar16 & 8) == 0) {
    bVar7 = chip->eg_kon[uVar36];
    bVar24 = 1;
    bVar31 = 0;
  }
  else {
    bVar31 = chip->eg_ssg_dir[uVar36];
    bVar24 = 1;
    if ((*(byte *)((long)chip->eg_level + uVar36 * 2 + 1) & 2) != 0) {
      if ((bVar16 & 3) == 0) {
        chip->eg_ssg_pgrst_latch[uVar36] = '\x01';
      }
      if ((bVar16 & 1) == 0) {
        chip->eg_ssg_repeat_latch[uVar36] = '\x01';
      }
      bVar31 = 1;
      bVar24 = bVar16;
      if ((bVar16 & 3) != 3) {
        bVar31 = chip->eg_ssg_dir[uVar36] ^ (bVar16 & 3) == 2;
      }
    }
    if ((chip->eg_kon_latch[uVar36] != '\0') && (((bVar16 & 7) == 5 || ((bVar16 & 7) == 3)))) {
      chip->eg_ssg_hold_up_latch[uVar36] = '\x01';
    }
    bVar7 = chip->eg_kon[uVar36];
    bVar31 = bVar31 & bVar7;
  }
  chip->eg_ssg_dir[uVar36] = bVar31;
  bVar28 = bVar16 >> 3 & 1;
  chip->eg_ssg_enable[uVar36] = bVar28;
  chip->eg_ssg_inv[uVar36] = (bVar16 >> 2 & bVar28 ^ bVar31) & bVar7;
  bVar31 = chip->eg_rate * '\x02' + chip->eg_ksv;
  bVar16 = 0x3f;
  if (bVar31 < 0x3f) {
    bVar16 = bVar31;
  }
  if ((chip->eg_rate == '\0') || (chip->eg_quotient != 2)) {
LAB_0013e51b:
    bVar31 = 0;
  }
  else if (bVar31 < 0x30) {
    bVar28 = (bVar16 >> 2) + chip->eg_shift_lock & 0xf;
    bVar31 = bVar16;
    if (bVar28 != 0xe) {
      if (bVar28 != 0xd) {
        if (bVar28 != 0xc) goto LAB_0013e51b;
        bVar31 = 1;
        goto LAB_0013e51d;
      }
      bVar31 = bVar16 >> 1;
    }
    bVar31 = bVar31 & 1;
  }
  else {
    bVar28 = ((bVar16 >> 2) +
             (char)*(undefined4 *)
                    ((long)eg_stephi[0] +
                    (ulong)chip->eg_timer_low_lock * 4 + (ulong)((bVar16 & 3) << 4))) - 0xb;
    bVar31 = 4;
    if (bVar28 < 4) {
      bVar31 = bVar28;
    }
  }
LAB_0013e51d:
  chip->eg_inc = bVar31;
  chip->eg_ratemax = (~bVar16 & 0x3e) == 0;
  if (bVar7 == 0) {
    if (chip->eg_kon_latch[uVar36] == '\0') goto code_r0x0013e553;
switchD_0013e563_caseD_0:
    BVar9 = chip->ar[uVar36];
    goto LAB_0013e56d;
  }
  if ((bVar24 & 1) == 0) goto switchD_0013e563_caseD_0;
code_r0x0013e553:
  switch(chip->eg_state[uVar36]) {
  case '\0':
    goto switchD_0013e563_caseD_0;
  case '\x01':
    BVar9 = chip->dr[uVar36];
    break;
  case '\x02':
    BVar9 = chip->sr[uVar36];
    break;
  case '\x03':
    BVar9 = chip->rr[uVar36] * '\x02' + '\x01';
    break;
  default:
    goto switchD_0013e563_default;
  }
LAB_0013e56d:
  chip->eg_rate = BVar9;
switchD_0013e563_default:
  chip->eg_ksv = chip->pg_kcode >> ((chip->ks[uVar36] ^ 3) & 0x1f);
  if (chip->am[uVar36] == '\0') {
    bVar16 = 0;
  }
  else {
    bVar16 = chip->lfo_am >> ("\a\x03\x01"[chip->ams[uVar37]] & 0x1f);
  }
  chip->eg_lfo_am = bVar16;
  BVar9 = chip->eg_sl[0];
  chip->eg_tl[1] = chip->eg_tl[0];
  chip->eg_tl[0] = chip->tl[uVar36];
  chip->eg_sl[1] = BVar9;
  chip->eg_sl[0] = chip->sl[uVar36];
  if (chip->mode_ch3 == '\0') {
LAB_0013e62d:
    uVar11 = (uVar11 + 1) % 6;
    chip->pg_fnum = chip->fnum[uVar11];
    pBVar15 = chip->kcode + uVar11;
    chip->pg_block = chip->block[uVar11];
  }
  else {
    uVar12 = uVar35 - 1 >> 1 | (uint)((uVar35 - 1 & 1) != 0) << 0x1f;
    if (uVar12 == 6) {
      chip->pg_fnum = chip->fnum_3ch[2];
      chip->pg_block = chip->block_3ch[2];
      pBVar15 = chip->kcode_3ch + 2;
    }
    else if (uVar12 == 3) {
      chip->pg_fnum = chip->fnum_3ch[0];
      chip->pg_block = chip->block_3ch[0];
      pBVar15 = chip->kcode_3ch;
    }
    else {
      if (uVar12 != 0) goto LAB_0013e62d;
      chip->pg_fnum = chip->fnum_3ch[1];
      chip->pg_block = chip->block_3ch[1];
      pBVar15 = chip->kcode_3ch + 1;
    }
  }
  chip->pg_kcode = *pBVar15;
  if ((lfo_samples_per_step[chip->lfo_freq] & ~(uint)chip->lfo_quotient) == 0) {
    bVar8 = chip->lfo_cnt + 1;
    BVar9 = '\0';
  }
  else {
    BVar9 = bVar8 + chip->lfo_quotient;
    bVar8 = chip->lfo_cnt;
  }
  chip->lfo_quotient = BVar9;
  chip->lfo_cnt = bVar8 & chip->lfo_en;
  BVar9 = chip->write_fm_data;
  if (BVar9 != '\0') {
    uVar35 = uVar35 % 0xc;
    uVar33 = chip->address;
    if (op_offset[uVar35] == (uVar33 & 0x107)) {
      uVar11 = uVar35 + 0xc;
      if ((uVar33 & 8) == 0) {
        uVar11 = uVar35;
      }
      switch((uVar33 & 0xf0) - 0x30 >> 4) {
      case 0:
        bVar8 = chip->data;
        bVar16 = bVar8 & 0xf;
        BVar32 = '\x01';
        if (bVar16 != 0) {
          BVar32 = bVar16 * '\x02';
        }
        chip->multi[uVar11] = BVar32;
        chip->dt[uVar11] = bVar8 >> 4 & 7;
        break;
      case 1:
        chip->tl[uVar11] = chip->data & 0x7f;
        break;
      case 2:
        bVar8 = chip->data;
        chip->ar[uVar11] = bVar8 & 0x1f;
        chip->ks[uVar11] = bVar8 >> 6;
        break;
      case 3:
        bVar8 = chip->data;
        chip->dr[uVar11] = bVar8 & 0x1f;
        chip->am[uVar11] = bVar8 >> 7;
        break;
      case 4:
        chip->sr[uVar11] = chip->data & 0x1f;
        break;
      case 5:
        bVar8 = chip->data;
        chip->rr[uVar11] = bVar8 & 0xf;
        bVar8 = bVar8 >> 4;
        chip->sl[uVar11] = bVar8 + 1 & 0x10 | bVar8;
        break;
      case 6:
        chip->ssg_eg[uVar11] = chip->data & 0xf;
      }
    }
    if (ch_offset[uVar37] == (uVar33 & 0x103)) {
      switch((uVar33 & 0xfc) - 0xa0 >> 2) {
      case 0:
        bVar8 = chip->reg_a4;
        chip->fnum[uVar37] = (bVar8 & 7) << 8 | (ushort)chip->data;
        bVar8 = bVar8 >> 3 & 7;
        chip->block[uVar37] = bVar8;
        chip->kcode[uVar37] = bVar8 << 2 | (byte)fn_note[chip->fnum[uVar37] >> 7];
        break;
      case 1:
        chip->reg_a4 = chip->data;
        break;
      case 2:
        bVar8 = chip->reg_ac;
        chip->fnum_3ch[uVar37] = (bVar8 & 7) << 8 | (ushort)chip->data;
        bVar8 = bVar8 >> 3 & 7;
        chip->block_3ch[uVar37] = bVar8;
        chip->kcode_3ch[uVar37] = bVar8 << 2 | (byte)fn_note[chip->fnum_3ch[uVar37] >> 7];
        break;
      case 3:
        chip->reg_ac = chip->data;
        break;
      case 4:
        bVar8 = chip->data;
        chip->connect[uVar37] = bVar8 & 7;
        chip->fb[uVar37] = bVar8 >> 3 & 7;
        break;
      case 5:
        bVar8 = chip->data;
        chip->pms[uVar37] = bVar8 & 7;
        chip->ams[uVar37] = bVar8 >> 4 & 3;
        chip->pan_l[uVar37] = bVar8 >> 7;
        chip->pan_r[uVar37] = bVar8 >> 6 & 1;
      }
    }
  }
  if (bVar20 == 1) {
    BVar9 = chip->write_fm_address != '\0' && bVar23 == 1;
    chip->write_fm_data = BVar9;
    bVar39 = (chip->write_data & 0xf0) != 0;
    if (bVar39) {
      chip->address = chip->write_data;
    }
    chip->write_fm_address = bVar39;
    if (bVar23 == 1) goto LAB_0013ea58;
  }
  else {
    if (bVar23 != 1) goto LAB_0013ed5b;
    if (chip->write_fm_address != '\0') {
      chip->write_fm_data = '\x01';
      BVar9 = '\x01';
    }
LAB_0013ea58:
    uVar33 = chip->write_data;
    if (((uVar33 >> 8 & 1) == 0) && (chip->write_fm_mode_a - 0x21 < 0xc)) {
      bVar8 = (byte)uVar33;
      switch((uint)chip->write_fm_mode_a) {
      case 0x21:
        uVar4 = uVar33 >> 4 & 0xff;
        uVar5 = uVar33 >> 5 & 0xff;
        uVar6 = uVar33 >> 6 & 0xff;
        uVar40 = uVar33 >> 7 & 0xff;
        uVar22 = uVar33 & 0xff;
        uVar19 = uVar33 >> 1 & 0xff;
        uVar2 = uVar33 >> 2 & 0xff;
        uVar3 = uVar33 >> 3 & 0xff;
        bVar7 = (uVar22 != 0) * (uVar22 < 0x100) * bVar8 - (0xff < uVar22);
        bVar28 = (uVar19 != 0) * (uVar19 < 0x100) * (char)(uVar33 >> 1) - (0xff < uVar19);
        bVar1 = (uVar2 != 0) * (uVar2 < 0x100) * (char)(uVar33 >> 2) - (0xff < uVar2);
        bVar8 = (uVar3 != 0) * (uVar3 < 0x100) * (char)(uVar33 >> 3) - (0xff < uVar3);
        bVar24 = (uVar4 != 0) * (uVar4 < 0x100) * (char)(uVar33 >> 4) - (0xff < uVar4);
        bVar31 = (uVar5 != 0) * (uVar5 < 0x100) * (char)(uVar33 >> 5) - (0xff < uVar5);
        bVar23 = (uVar6 != 0) * (uVar6 < 0x100) * (char)(uVar33 >> 6) - (0xff < uVar6);
        bVar16 = (uVar40 != 0) * (uVar40 < 0x100) * (char)(uVar33 >> 7) - (0xff < uVar40);
        *(ulong *)chip->mode_test_21 =
             CONCAT17((bVar16 != 0) * (bVar16 < 0x100) * bVar16 - (0xff < bVar16),
                      CONCAT16((bVar23 != 0) * (bVar23 < 0x100) * bVar23 - (0xff < bVar23),
                               CONCAT15((bVar31 != 0) * (bVar31 < 0x100) * bVar31 - (0xff < bVar31),
                                        CONCAT14((bVar24 != 0) * (bVar24 < 0x100) * bVar24 -
                                                 (0xff < bVar24),
                                                 CONCAT13((bVar8 != 0) * (bVar8 < 0x100) * bVar8 -
                                                          (0xff < bVar8),
                                                          CONCAT12((bVar1 != 0) * (bVar1 < 0x100) *
                                                                   bVar1 - (0xff < bVar1),
                                                                   CONCAT11((bVar28 != 0) *
                                                                            (bVar28 < 0x100) *
                                                                            bVar28 - (0xff < bVar28)
                                                                            ,(bVar7 != 0) *
                                                                             (bVar7 < 0x100) * bVar7
                                                                             - (0xff < bVar7))))))))
             & (ulong)DAT_001778e0;
        break;
      case 0x22:
        bVar16 = 0x7f;
        if ((uVar33 & 8) == 0) {
          bVar16 = bVar8 & 8;
        }
        chip->lfo_en = bVar16;
        chip->lfo_freq = bVar8 & 7;
        break;
      case 0x24:
        chip->timer_a_reg = (chip->timer_a_reg & 3) + (uVar33 & 0xff) * 4;
        break;
      case 0x25:
        chip->timer_a_reg = uVar33 & 3 | chip->timer_a_reg & 0x3fc;
        break;
      case 0x26:
        chip->timer_b_reg = uVar33 & 0xff;
        break;
      case 0x27:
        chip->mode_ch3 = bVar8 >> 6;
        chip->mode_csm = bVar8 >> 6 == 2;
        chip->timer_a_load = bVar8 & 1;
        chip->timer_a_enable = bVar8 >> 2 & 1;
        chip->timer_a_reset = bVar8 >> 4 & 1;
        chip->timer_b_load = bVar8 >> 1 & 1;
        chip->timer_b_enable = bVar8 >> 3 & 1;
        chip->timer_b_reset = bVar8 >> 5 & 1;
        break;
      case 0x28:
        uVar22 = uVar33 >> 4 & 0xff;
        uVar19 = uVar33 >> 5 & 0xff;
        uVar2 = uVar33 >> 6 & 0xff;
        uVar3 = uVar33 >> 7 & 0xff;
        bVar31 = (uVar22 != 0) * (uVar22 < 0x100) * (char)(uVar33 >> 4) - (0xff < uVar22);
        bVar8 = (uVar19 != 0) * (uVar19 < 0x100) * (char)(uVar33 >> 5) - (0xff < uVar19);
        bVar23 = (uVar2 != 0) * (uVar2 < 0x100) * (char)(uVar33 >> 6) - (0xff < uVar2);
        bVar16 = (uVar3 != 0) * (uVar3 < 0x100) * (char)(uVar33 >> 7) - (0xff < uVar3);
        *(uint *)chip->mode_kon_operator =
             CONCAT13((bVar16 != 0) * (bVar16 < 0x100) * bVar16 - (0xff < bVar16),
                      CONCAT12((bVar23 != 0) * (bVar23 < 0x100) * bVar23 - (0xff < bVar23),
                               CONCAT11((bVar8 != 0) * (bVar8 < 0x100) * bVar8 - (0xff < bVar8),
                                        (bVar31 != 0) * (bVar31 < 0x100) * bVar31 - (0xff < bVar31))
                              )) & (uint)DAT_001778f0;
        uVar35 = uVar33 & 3;
        if (uVar35 == 3) {
          chip->mode_kon_channel = 0xff;
        }
        else {
          chip->mode_kon_channel = ((byte)((int)((uint)uVar33 << 0x1d) >> 0x1f) & 3) + (char)uVar35;
        }
        break;
      case 0x2a:
        chip->dacdata = (chip->dacdata & 1U) + uVar33 * 2 ^ 0x100;
        break;
      case 0x2b:
        chip->dacen = (Bit8u)(uVar33 >> 7);
        break;
      case 0x2c:
        uVar3 = uVar33 >> 4 & 0xff;
        uVar4 = uVar33 >> 5 & 0xff;
        uVar5 = uVar33 >> 6 & 0xff;
        uVar6 = uVar33 >> 7 & 0xff;
        uVar40 = uVar33 & 0xff;
        uVar22 = uVar33 >> 1 & 0xff;
        uVar19 = uVar33 >> 2 & 0xff;
        uVar2 = uVar33 >> 3 & 0xff;
        bVar8 = (uVar40 != 0) * (uVar40 < 0x100) * bVar8 - (0xff < uVar40);
        bVar16 = (uVar22 != 0) * (uVar22 < 0x100) * (char)(uVar33 >> 1) - (0xff < uVar22);
        bVar23 = (uVar19 != 0) * (uVar19 < 0x100) * (char)(uVar33 >> 2) - (0xff < uVar19);
        bVar31 = (uVar2 != 0) * (uVar2 < 0x100) * (char)(uVar33 >> 3) - (0xff < uVar2);
        bVar24 = (uVar3 != 0) * (uVar3 < 0x100) * (char)(uVar33 >> 4) - (0xff < uVar3);
        bVar7 = (uVar4 != 0) * (uVar4 < 0x100) * (char)(uVar33 >> 5) - (0xff < uVar4);
        bVar28 = (uVar5 != 0) * (uVar5 < 0x100) * (char)(uVar33 >> 6) - (0xff < uVar5);
        bVar1 = (uVar6 != 0) * (uVar6 < 0x100) * (char)(uVar33 >> 7) - (0xff < uVar6);
        *(ulong *)chip->mode_test_2c =
             CONCAT17((bVar1 != 0) * (bVar1 < 0x100) * bVar1 - (0xff < bVar1),
                      CONCAT16((bVar28 != 0) * (bVar28 < 0x100) * bVar28 - (0xff < bVar28),
                               CONCAT15((bVar7 != 0) * (bVar7 < 0x100) * bVar7 - (0xff < bVar7),
                                        CONCAT14((bVar24 != 0) * (bVar24 < 0x100) * bVar24 -
                                                 (0xff < bVar24),
                                                 CONCAT13((bVar31 != 0) * (bVar31 < 0x100) * bVar31
                                                          - (0xff < bVar31),
                                                          CONCAT12((bVar23 != 0) * (bVar23 < 0x100)
                                                                   * bVar23 - (0xff < bVar23),
                                                                   CONCAT11((bVar16 != 0) *
                                                                            (bVar16 < 0x100) *
                                                                            bVar16 - (0xff < bVar16)
                                                                            ,(bVar8 != 0) *
                                                                             (bVar8 < 0x100) * bVar8
                                                                             - (0xff < bVar8))))))))
             & (ulong)DAT_001778e0;
        chip->dacdata = (ushort)chip->mode_test_2c[3] | chip->dacdata & 0x1feU;
        if (chip->mode_test_2c[7] == '\0') {
          bVar39 = chip->mode_test_2c[6] != '\0';
        }
        else {
          bVar39 = false;
        }
        chip->eg_custom_timer = bVar39;
      }
    }
    if (bVar20 != 1) goto LAB_0013ed5b;
  }
  chip->write_fm_mode_a = chip->write_data & 0x1ff;
LAB_0013ed5b:
  if (BVar9 != '\0') {
    chip->data = (Bit8u)chip->write_data;
  }
  BVar14 = chip->cycles + ((chip->cycles + 1) / 0x18) * -0x18 + 1;
  chip->cycles = BVar14;
  chip->channel = (uint)(byte)((char)BVar14 + ((byte)(BVar14 * 0x2b >> 7) & 0xfe) * -3);
  *buffer = (int)(short)local_40;
  buffer[1] = BVar30;
  if (chip->status_time != 0) {
    chip->status_time = chip->status_time - 1;
  }
  return;
}

Assistant:

void NOPN2_Clock(ym3438_t *chip, Bit32s *buffer)
{
    Bit32u slot = chip->cycles;
    chip->lfo_inc = chip->mode_test_21[1];
    chip->pg_read >>= 1;
    chip->eg_read[1] >>= 1;
    chip->eg_cycle++;
    /* Lock envelope generator timer value */
    if (chip->cycles == 1 && chip->eg_quotient == 2)
    {
        if (chip->eg_cycle_stop)
        {
            chip->eg_shift_lock = 0;
        }
        else
        {
            chip->eg_shift_lock = chip->eg_shift + 1;
        }
        chip->eg_timer_low_lock = chip->eg_timer & 0x03;
    }
    /* Cycle specific functions */
    switch (chip->cycles)
    {
    case 0:
        chip->lfo_pm = chip->lfo_cnt >> 2;
        if (chip->lfo_cnt & 0x40)
        {
            chip->lfo_am = chip->lfo_cnt & 0x3f;
        }
        else
        {
            chip->lfo_am = chip->lfo_cnt ^ 0x3f;
        }
        chip->lfo_am <<= 1;
        break;
    case 1:
        chip->eg_quotient++;
        chip->eg_quotient %= 3;
        chip->eg_cycle = 0;
        chip->eg_cycle_stop = 1;
        chip->eg_shift = 0;
        chip->eg_timer_inc |= chip->eg_quotient >> 1;
        chip->eg_timer = chip->eg_timer + chip->eg_timer_inc;
        chip->eg_timer_inc = chip->eg_timer >> 12;
        chip->eg_timer &= 0xfff;
        break;
    case 2:
        chip->pg_read = chip->pg_phase[21] & 0x3ff;
        chip->eg_read[1] = chip->eg_out[0];
        break;
    case 13:
        chip->eg_cycle = 0;
        chip->eg_cycle_stop = 1;
        chip->eg_shift = 0;
        chip->eg_timer = chip->eg_timer + chip->eg_timer_inc;
        chip->eg_timer_inc = chip->eg_timer >> 12;
        chip->eg_timer &= 0xfff;
        break;
    case 23:
        chip->lfo_inc |= 1;
        break;
    }
    chip->eg_timer &= ~(chip->mode_test_21[5] << chip->eg_cycle);
    if (((chip->eg_timer >> chip->eg_cycle) | (chip->pin_test_in & chip->eg_custom_timer)) & chip->eg_cycle_stop)
    {
        chip->eg_shift = chip->eg_cycle;
        chip->eg_cycle_stop = 0;
    }

    NOPN2_DoIO(chip);

    NOPN2_DoTimerA(chip);
    NOPN2_DoTimerB(chip);
    NOPN2_KeyOn(chip);

    NOPN2_ChOutput(chip);
    NOPN2_ChGenerate(chip);

    NOPN2_FMPrepare(chip);
    NOPN2_FMGenerate(chip);

    NOPN2_PhaseGenerate(chip);
    NOPN2_PhaseCalcIncrement(chip);

    NOPN2_EnvelopeADSR(chip);
    NOPN2_EnvelopeGenerate(chip);
    NOPN2_EnvelopeSSGEG(chip);
    NOPN2_EnvelopePrepare(chip);

    /* Prepare fnum & block */
    if (chip->mode_ch3)
    {
        /* Channel 3 special mode */
        switch (slot)
        {
        case 1: /* OP1 */
            chip->pg_fnum = chip->fnum_3ch[1];
            chip->pg_block = chip->block_3ch[1];
            chip->pg_kcode = chip->kcode_3ch[1];
            break;
        case 7: /* OP3 */
            chip->pg_fnum = chip->fnum_3ch[0];
            chip->pg_block = chip->block_3ch[0];
            chip->pg_kcode = chip->kcode_3ch[0];
            break;
        case 13: /* OP2 */
            chip->pg_fnum = chip->fnum_3ch[2];
            chip->pg_block = chip->block_3ch[2];
            chip->pg_kcode = chip->kcode_3ch[2];
            break;
        case 19: /* OP4 */
        default:
            chip->pg_fnum = chip->fnum[(chip->channel + 1) % 6];
            chip->pg_block = chip->block[(chip->channel + 1) % 6];
            chip->pg_kcode = chip->kcode[(chip->channel + 1) % 6];
            break;
        }
    }
    else
    {
        chip->pg_fnum = chip->fnum[(chip->channel + 1) % 6];
        chip->pg_block = chip->block[(chip->channel + 1) % 6];
        chip->pg_kcode = chip->kcode[(chip->channel + 1) % 6];
    }

    NOPN2_UpdateLFO(chip);
    NOPN2_DoRegWrite(chip);
    chip->cycles = (chip->cycles + 1) % 24;
    chip->channel = chip->cycles % 6;

    buffer[0] = chip->mol;
    buffer[1] = chip->mor;

    if (chip->status_time)
        chip->status_time--;
}